

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_colorspace_set_endpoints
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_XYZ *XYZ_in,int preferred)

{
  int iVar1;
  undefined1 local_78 [8];
  png_xy xy;
  png_XYZ XYZ;
  int preferred_local;
  png_XYZ *XYZ_in_local;
  png_colorspacerp colorspace_local;
  png_const_structrp png_ptr_local;
  
  xy.whitex = XYZ_in->red_X;
  xy.whitey = XYZ_in->red_Y;
  iVar1 = png_colorspace_check_XYZ((png_xy *)local_78,(png_XYZ *)&xy.whitex);
  if (iVar1 == 0) {
    png_ptr_local._4_4_ =
         png_colorspace_set_xy_and_XYZ
                   (png_ptr,colorspace,(png_xy *)local_78,(png_XYZ *)&xy.whitex,preferred);
  }
  else {
    if (iVar1 != 1) {
      colorspace->flags = colorspace->flags | 0x8000;
      png_error(png_ptr,"internal error checking chromaticities");
    }
    colorspace->flags = colorspace->flags | 0x8000;
    png_benign_error(png_ptr,"invalid end points");
    png_ptr_local._4_4_ = 0;
  }
  return png_ptr_local._4_4_;
}

Assistant:

int /* PRIVATE */
png_colorspace_set_endpoints(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_XYZ *XYZ_in, int preferred)
{
   png_XYZ XYZ = *XYZ_in;
   png_xy xy;

   switch (png_colorspace_check_XYZ(&xy, &XYZ))
   {
      case 0:
         return png_colorspace_set_xy_and_XYZ(png_ptr, colorspace, &xy, &XYZ,
             preferred);

      case 1:
         /* End points are invalid. */
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "invalid end points");
         break;

      default:
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_error(png_ptr, "internal error checking chromaticities");
   }

   return 0; /* failed */
}